

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O1

data_view * __thiscall
helics::Input::checkAndGetFedUpdate(data_view *__return_storage_ptr__,Input *this)

{
  bool bVar1;
  
  if ((this->fed != (ValueFederate *)0x0) &&
     ((bVar1 = helics::ValueFederate::isUpdated(this->fed,this), bVar1 ||
      (((this->hasUpdate == true && (this->changeDetectionEnabled == false)) &&
       (this->inputVectorOp == NO_OP)))))) {
    helics::ValueFederate::getBytes(__return_storage_ptr__,this->fed,this);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->ref).
  super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->ref).
  super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->dblock)._M_len = 0;
  (__return_storage_ptr__->dblock)._M_str = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

data_view Input::checkAndGetFedUpdate()
{
    return ((fed != nullptr) && (fed->isUpdated(*this) || allowDirectFederateUpdate())) ?
        (fed->getBytes(*this)) :
        data_view{};
}